

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

void __thiscall
pbrt::TriQuadMesh::
Refine<pbrt::Shape::Create(std::__cxx11::string_const&,pbrt::Transform_const*,pbrt::Transform_const*,bool,pbrt::ParameterDictionary_const&,std::map<std::__cxx11::string,pbrt::FloatTexture,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pbrt::FloatTexture>>>const&,pbrt::FileLoc_const*,pstd::pmr::polymorphic_allocator<std::byte>)::__1&>
          (TriQuadMesh *this,anon_class_8_1_8ae8b03d *distance,Float maxDist,int v0,int v1,int v2,
          HashMap<std::pair<int,_int>,_int,_pbrt::HashIntPair,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>_>
          *edgeSplit)

{
  int iVar1;
  Point2<float> c;
  Normal3<float> c_00;
  Normal3<float> n;
  Point3f v1_00;
  Point3f v1_01;
  Point3f v1_02;
  Point3f v0_00;
  Point3f v0_01;
  Point3f v0_02;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  reference __y;
  reference pvVar5;
  Float in_ECX;
  int in_EDX;
  TriQuadMesh *in_RSI;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *in_RDI;
  int in_R8D;
  undefined8 in_R9;
  float in_XMM0_Da;
  type tVar6;
  undefined1 auVar13 [56];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  Point3<float> PVar14;
  Normal3<float> NVar15;
  Normal3f nn;
  int vmid;
  pair<int,_int> edge;
  array<int,_3UL> v;
  Float d20;
  Float d12;
  Float d01;
  Point3f p2;
  Point3f p1;
  Point3f p0;
  pair<int,_int> *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  float in_stack_fffffffffffffd18;
  float in_stack_fffffffffffffd1c;
  HashMap<std::pair<int,_int>,_int,_pbrt::HashIntPair,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>_>
  *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  float in_stack_fffffffffffffd38;
  int *in_stack_fffffffffffffd40;
  pair<int,_int> *in_stack_fffffffffffffd48;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *this_00;
  HashMap<std::pair<int,_int>,_int,_pbrt::HashIntPair,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>_>
  *in_stack_fffffffffffffd50;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *this_01;
  float fVar16;
  anon_class_8_1_8ae8b03d *in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffde8;
  float in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffe08;
  float in_stack_fffffffffffffe10;
  pair<int,_int> local_15c [8];
  undefined8 local_118;
  float local_110;
  undefined8 local_108;
  float local_100;
  undefined8 local_f8;
  float local_f0;
  undefined8 local_e8;
  float local_e0;
  type local_dc;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a8;
  float local_a0;
  float local_9c;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  type local_5c;
  undefined8 local_58;
  float local_50;
  undefined8 local_48;
  float local_40;
  undefined8 local_38;
  float fVar17;
  undefined4 in_stack_ffffffffffffffd4;
  TriQuadMesh *this_02;
  undefined1 auVar7 [64];
  undefined1 auVar9 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  pvVar3 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                     (in_RDI,(long)in_EDX);
  fVar17 = (pvVar3->super_Tuple3<pbrt::Point3,_float>).z;
  local_38._0_4_ = (pvVar3->super_Tuple3<pbrt::Point3,_float>).x;
  local_38._4_4_ = (pvVar3->super_Tuple3<pbrt::Point3,_float>).y;
  pvVar3 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                     (in_RDI,(long)(int)in_ECX);
  local_40 = (pvVar3->super_Tuple3<pbrt::Point3,_float>).z;
  local_48._0_4_ = (pvVar3->super_Tuple3<pbrt::Point3,_float>).x;
  local_48._4_4_ = (pvVar3->super_Tuple3<pbrt::Point3,_float>).y;
  local_80 = fVar17;
  pvVar3 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                     (in_RDI,(long)in_R8D);
  local_50 = (pvVar3->super_Tuple3<pbrt::Point3,_float>).z;
  local_58._0_4_ = (pvVar3->super_Tuple3<pbrt::Point3,_float>).x;
  local_58._4_4_ = (pvVar3->super_Tuple3<pbrt::Point3,_float>).y;
  local_68 = local_38;
  local_70 = local_40;
  local_78 = local_48;
  local_88 = local_38;
  local_90 = local_40;
  local_98 = local_48;
  v0_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffe10;
  v0_00.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffe08;
  v0_00.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffe08 >> 0x20)
  ;
  v1_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffdf0;
  v1_00.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffde8;
  v1_00.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffde8 >> 0x20)
  ;
  local_60 = local_80;
  fVar17 = local_80;
  local_5c = Shape::Create::anon_class_8_1_8ae8b03d::operator()
                       (in_stack_fffffffffffffdd0,v0_00,v1_00);
  local_a0 = local_40;
  local_a8 = local_48;
  local_b0 = local_50;
  local_b8 = local_58;
  local_c0 = local_40;
  local_c8 = local_48;
  local_d0 = local_50;
  local_d8 = local_58;
  v0_01.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffe10;
  v0_01.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffe08;
  v0_01.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffe08 >> 0x20)
  ;
  v1_01.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffdf0;
  v1_01.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffde8;
  v1_01.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffde8 >> 0x20)
  ;
  local_110 = fVar17;
  local_9c = Shape::Create::anon_class_8_1_8ae8b03d::operator()
                       (in_stack_fffffffffffffdd0,v0_01,v1_01);
  local_e0 = local_50;
  local_e8 = local_58;
  local_f8 = local_38;
  local_100 = local_50;
  local_108 = local_58;
  local_118 = local_38;
  v0_02.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffe10;
  v0_02.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffe08;
  v0_02.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffe08 >> 0x20)
  ;
  v1_02.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffdf0;
  v1_02.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffde8;
  v1_02.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffde8 >> 0x20)
  ;
  local_f0 = local_110;
  fVar17 = local_110;
  local_dc = Shape::Create::anon_class_8_1_8ae8b03d::operator()
                       (in_stack_fffffffffffffdd0,v0_02,v1_02);
  if (((in_XMM0_Da <= local_5c) || (in_XMM0_Da <= local_9c)) || (in_XMM0_Da <= local_dc)) {
    pvVar4 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                        (size_type)in_stack_fffffffffffffd08);
    __y = std::array<int,_3UL>::operator[]
                    ((array<int,_3UL> *)
                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     (size_type)in_stack_fffffffffffffd08);
    std::pair<int,_int>::pair<int_&,_int_&,_true>(local_15c,pvVar4,__y);
    pvVar4 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                        (size_type)in_stack_fffffffffffffd08);
    iVar1 = *pvVar4;
    pvVar4 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                        (size_type)in_stack_fffffffffffffd08);
    if (*pvVar4 < iVar1) {
      std::swap<int>(&local_15c[0].first,&local_15c[0].second);
    }
    bVar2 = HashMap<std::pair<int,_int>,_int,_pbrt::HashIntPair,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>_>
            ::HasKey((HashMap<std::pair<int,_int>,_int,_pbrt::HashIntPair,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     in_stack_fffffffffffffd08);
    if (bVar2) {
      HashMap<std::pair<int,_int>,_int,_pbrt::HashIntPair,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>_>
      ::operator[](in_stack_fffffffffffffd20,
                   (pair<int,_int> *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    }
    else {
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size(in_RDI);
      HashMap<std::pair<int,_int>,_int,_pbrt::HashIntPair,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>_>
      ::Insert(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      pvVar4 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                          (size_type)in_stack_fffffffffffffd08);
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                (in_RDI,(long)*pvVar4);
      pvVar4 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                          (size_type)in_stack_fffffffffffffd08);
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                (in_RDI,(long)*pvVar4);
      auVar13 = ZEXT856(0);
      PVar14.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffd34;
      PVar14.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffd30;
      PVar14.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffd38;
      PVar14 = Tuple3<pbrt::Point3,float>::operator+
                         ((Tuple3<pbrt::Point3,_float> *)
                          CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),PVar14);
      auVar7._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar7._8_56_ = auVar13;
      vmovlpd_avx(auVar7._0_16_);
      PVar14 = Tuple3<pbrt::Point3,float>::operator/
                         ((Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffffd20,
                          (int)in_stack_fffffffffffffd1c);
      auVar8._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar8._8_56_ = auVar13;
      vmovlpd_avx(auVar8._0_16_);
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::push_back
                ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                 CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                 (value_type *)in_stack_fffffffffffffd08);
      bVar2 = std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::empty
                        ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                         in_stack_fffffffffffffd20);
      if (!bVar2) {
        this_01 = (vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                  (in_RDI + 1);
        pvVar4 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                            (size_type)in_stack_fffffffffffffd08);
        pvVar5 = std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::
                 operator[](this_01,(long)*pvVar4);
        fVar16 = SUB84(pvVar5,0);
        pvVar4 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                            (size_type)in_stack_fffffffffffffd08);
        std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::operator[]
                  (this_01,(long)*pvVar4);
        auVar13 = ZEXT856(0);
        c_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffd34;
        c_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffd30;
        c_00.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffd38;
        NVar15 = Tuple3<pbrt::Normal3,float>::operator+
                           ((Tuple3<pbrt::Normal3,_float> *)
                            CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),c_00);
        auVar9._0_8_ = NVar15.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar9._8_56_ = auVar13;
        vmovlpd_avx(auVar9._0_16_);
        NVar15.super_Tuple3<pbrt::Normal3,_float>._4_8_ = in_stack_fffffffffffffd20;
        NVar15.super_Tuple3<pbrt::Normal3,_float>.x = in_stack_fffffffffffffd1c;
        tVar6 = LengthSquared<float>(NVar15);
        if (0.0 < tVar6) {
          auVar13 = ZEXT856(0);
          n.super_Tuple3<pbrt::Normal3,_float>.z = fVar16;
          n.super_Tuple3<pbrt::Normal3,_float>._0_8_ = this_01;
          NVar15 = Normalize<float>(n);
          auVar10._0_8_ = NVar15.super_Tuple3<pbrt::Normal3,_float>._0_8_;
          auVar10._8_56_ = auVar13;
          vmovlpd_avx(auVar10._0_16_);
        }
        std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::push_back
                  ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                   in_stack_fffffffffffffd20,
                   (value_type *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      }
      bVar2 = std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::empty
                        ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                         in_stack_fffffffffffffd20);
      if (!bVar2) {
        this_00 = (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)(in_RDI + 2)
        ;
        pvVar4 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                            (size_type)in_stack_fffffffffffffd08);
        std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::operator[]
                  (this_00,(long)*pvVar4);
        pvVar4 = std::array<int,_3UL>::operator[]
                           ((array<int,_3UL> *)
                            CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                            (size_type)in_stack_fffffffffffffd08);
        std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::operator[]
                  (this_00,(long)*pvVar4);
        c.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffd1c;
        c.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffd18;
        auVar11._0_8_ =
             Tuple2<pbrt::Point2,float>::operator+
                       ((Tuple2<pbrt::Point2,_float> *)
                        CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),c);
        auVar11._8_56_ = extraout_var;
        vmovlpd_avx(auVar11._0_16_);
        auVar12._0_8_ =
             Tuple2<pbrt::Point2,float>::operator/
                       ((Tuple2<pbrt::Point2,_float> *)
                        CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                        in_stack_fffffffffffffd14);
        auVar12._8_56_ = extraout_var_00;
        vmovlpd_avx(auVar12._0_16_);
        std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::push_back
                  ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                   (value_type *)in_stack_fffffffffffffd08);
      }
    }
    fVar16 = in_XMM0_Da;
    this_02 = in_RSI;
    std::array<int,_3UL>::operator[]
              ((array<int,_3UL> *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffd10),(size_type)in_RSI);
    std::array<int,_3UL>::operator[]
              ((array<int,_3UL> *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffd10),(size_type)in_RSI);
    Refine<pbrt::Shape::Create(std::__cxx11::string_const&,pbrt::Transform_const*,pbrt::Transform_const*,bool,pbrt::ParameterDictionary_const&,std::map<std::__cxx11::string,pbrt::FloatTexture,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pbrt::FloatTexture>>>const&,pbrt::FileLoc_const*,pstd::pmr::polymorphic_allocator<std::byte>)::__1&>
              (this_02,(anon_class_8_1_8ae8b03d *)CONCAT44(fVar16,in_EDX),in_ECX,in_R8D,
               (int)((ulong)in_R9 >> 0x20),(int)in_R9,
               (HashMap<std::pair<int,_int>,_int,_pbrt::HashIntPair,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffffd4,fVar17));
    std::array<int,_3UL>::operator[]
              ((array<int,_3UL> *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffd10),(size_type)in_RSI);
    std::array<int,_3UL>::operator[]
              ((array<int,_3UL> *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffd10),(size_type)in_RSI);
    Refine<pbrt::Shape::Create(std::__cxx11::string_const&,pbrt::Transform_const*,pbrt::Transform_const*,bool,pbrt::ParameterDictionary_const&,std::map<std::__cxx11::string,pbrt::FloatTexture,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pbrt::FloatTexture>>>const&,pbrt::FileLoc_const*,pstd::pmr::polymorphic_allocator<std::byte>)::__1&>
              (this_02,(anon_class_8_1_8ae8b03d *)CONCAT44(fVar16,in_EDX),in_ECX,in_R8D,
               (int)((ulong)in_R9 >> 0x20),(int)in_R9,
               (HashMap<std::pair<int,_int>,_int,_pbrt::HashIntPair,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffffd4,fVar17));
  }
  else {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20,
               (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)
              );
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20,
               (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)
              );
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20,
               (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)
              );
  }
  return;
}

Assistant:

void Refine(Dist &&distance, Float maxDist, int v0, int v1, int v2,
                HashMap<std::pair<int, int>, int, HashIntPair> &edgeSplit) {
        Point3f p0 = p[v0], p1 = p[v1], p2 = p[v2];
        Float d01 = distance(p0, p1), d12 = distance(p1, p2), d20 = distance(p2, p0);

        if (d01 < maxDist && d12 < maxDist && d20 < maxDist) {
            triIndices.push_back(v0);
            triIndices.push_back(v1);
            triIndices.push_back(v2);
            return;
        }

        // order so that the first two vertices have the longest edge
        std::array<int, 3> v;
        if (d01 > d12) {
            if (d01 > d20)
                v = {v0, v1, v2};
            else
                v = {v2, v0, v1};
        } else {
            if (d12 > d20)
                v = {v1, v2, v0};
            else
                v = {v2, v0, v1};
        }

        // has the edge been spilt before?
        std::pair<int, int> edge(v[0], v[1]);
        if (v[0] > v[1])
            std::swap(edge.first, edge.second);

        int vmid;
        if (edgeSplit.HasKey(edge)) {
            vmid = edgeSplit[edge];
        } else {
            vmid = p.size();
            edgeSplit.Insert(edge, vmid);
            p.push_back((p[v[0]] + p[v[1]]) / 2);
            if (!n.empty()) {
                Normal3f nn = n[v[0]] + n[v[1]];
                if (LengthSquared(nn) > 0)
                    nn = Normalize(nn);
                n.push_back(nn);
            }
            if (!uv.empty())
                uv.push_back((uv[v[0]] + uv[v[1]]) / 2);
        }

        Refine(distance, maxDist, v[0], vmid, v[2], edgeSplit);
        Refine(distance, maxDist, vmid, v[1], v[2], edgeSplit);
    }